

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffbfwt(FITSfile *Fptr,int nbuff,int *status)

{
  FITSfile *pFVar1;
  void *buffer;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  LONGLONG filepos;
  long nloop;
  long minrec;
  long irec;
  long jj;
  int ibuff;
  int ii;
  undefined7 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffaf;
  long in_stack_ffffffffffffffb8;
  FITSfile *in_stack_ffffffffffffffc0;
  long local_38;
  long local_30;
  int local_28;
  int local_24;
  int local_4;
  
  if (*(int *)(in_RDI + 0x5c) == 0) {
    ffpmsg((char *)0x110459);
    if (*(int *)(in_RDI + 4) == 8) {
      ffpmsg((char *)0x110470);
    }
    *(undefined4 *)(in_RDI + 0x6a8 + (long)in_ESI * 4) = 0;
    *in_RDX = 0x70;
    local_4 = *in_RDX;
  }
  else {
    pFVar1 = (FITSfile *)(*(long *)(in_RDI + 0x568 + (long)in_ESI * 8) * 0xb40);
    if (*(long *)(in_RDI + 0x28) < (long)pFVar1) {
      if (*(long *)(in_RDI + 0x48) != *(long *)(in_RDI + 0x28)) {
        ffseek(pFVar1,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      }
      local_28 = 0x28;
      while (local_28 != in_ESI) {
        pFVar1 = (FITSfile *)(*(long *)(in_RDI + 0x28) / 0xb40);
        local_38 = *(long *)(in_RDI + 0x568 + (long)in_ESI * 8);
        local_28 = in_ESI;
        for (local_24 = 0; local_24 < 0x28; local_24 = local_24 + 1) {
          if (((long)pFVar1 <= *(long *)(in_RDI + 0x568 + (long)local_24 * 8)) &&
             (*(long *)(in_RDI + 0x568 + (long)local_24 * 8) < local_38)) {
            local_38 = *(long *)(in_RDI + 0x568 + (long)local_24 * 8);
            local_28 = local_24;
          }
        }
        buffer = (void *)(local_38 * 0xb40);
        if (*(long *)(in_RDI + 0x28) < (long)buffer) {
          in_stack_ffffffffffffffb8 = ((long)buffer - *(long *)(in_RDI + 0x28)) / 0xb40;
          local_30 = 0;
          while( true ) {
            in_stack_ffffffffffffffaf = 0;
            if (local_30 < in_stack_ffffffffffffffb8) {
              in_stack_ffffffffffffffaf = *in_RDX != 0 ^ 0xff;
            }
            if ((in_stack_ffffffffffffffaf & 1) == 0) break;
            ffwrite(pFVar1,in_stack_ffffffffffffffb8,buffer,
                    (int *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            local_30 = local_30 + 1;
          }
          *(void **)(in_RDI + 0x28) = buffer;
        }
        ffwrite(pFVar1,in_stack_ffffffffffffffb8,buffer,
                (int *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
        *(undefined4 *)(in_RDI + 0x6a8 + (long)local_28 * 4) = 0;
        *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 0xb40;
      }
      *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(in_RDI + 0x28);
    }
    else {
      if (*(FITSfile **)(in_RDI + 0x48) != pFVar1) {
        ffseek(pFVar1,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      }
      ffwrite(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,pFVar1,
              (int *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      *(LONGLONG **)(in_RDI + 0x48) = pFVar1[1].imgnaxis + 0x58;
      if (pFVar1 == *(FITSfile **)(in_RDI + 0x28)) {
        *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 0xb40;
      }
      *(undefined4 *)(in_RDI + 0x6a8 + (long)in_ESI * 4) = 0;
    }
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffbfwt(FITSfile *Fptr,        /* I - FITS file pointer           */
           int nbuff,             /* I - which buffer to write          */
           int *status)           /* IO - error status                  */
{
/*
  write contents of buffer to file;  If the position of the buffer
  is beyond the current EOF, then the file may need to be extended
  with fill values, and/or with the contents of some of the other
  i/o buffers.
*/
    int  ii,ibuff;
    long jj, irec, minrec, nloop;
    LONGLONG filepos;

    static char zeros[IOBUFLEN];  /*  initialized to zero by default */

    if (!(Fptr->writemode) )
    {
        ffpmsg("Error: trying to write to READONLY file.");
        if (Fptr->driver == 8) {  /* gzip compressed file */
	  ffpmsg("Cannot write to a GZIP or COMPRESS compressed file.");
	}
        Fptr->dirty[nbuff] = FALSE;  /* reset buffer status to prevent later probs */
        *status = READONLY_FILE;
        return(*status);
    }

    filepos = (LONGLONG)Fptr->bufrecnum[nbuff] * IOBUFLEN;

    if (filepos <= Fptr->filesize)
    {
      /* record is located within current file, so just write it */

      /* move to the correct write position */
      if (Fptr->io_pos != filepos)
         ffseek(Fptr, filepos);

      ffwrite(Fptr, IOBUFLEN, Fptr->iobuffer + (nbuff * IOBUFLEN), status);
      Fptr->io_pos = filepos + IOBUFLEN;

      if (filepos == Fptr->filesize)   /* appended new record? */
         Fptr->filesize += IOBUFLEN;   /* increment the file size */

      Fptr->dirty[nbuff] = FALSE;
    }

    else  /* if record is beyond the EOF, append any other records */ 
          /* and/or insert fill values if necessary */
    {
      /* move to EOF */
      if (Fptr->io_pos != Fptr->filesize)
         ffseek(Fptr, Fptr->filesize);

      ibuff = NIOBUF;  /* initialize to impossible value */
      while(ibuff != nbuff) /* repeat until requested buffer is written */
      {
        minrec = (long) (Fptr->filesize / IOBUFLEN);

        /* write lowest record beyond the EOF first */

        irec = Fptr->bufrecnum[nbuff]; /* initially point to the requested buffer */
        ibuff = nbuff;

        for (ii = 0; ii < NIOBUF; ii++)
        {
          if (Fptr->bufrecnum[ii] >= minrec &&
            Fptr->bufrecnum[ii] < irec)
          {
            irec = Fptr->bufrecnum[ii];  /* found a lower record */
            ibuff = ii;
          }
        }

        filepos = (LONGLONG)irec * IOBUFLEN;  /* byte offset of record in file */

        /* append 1 or more fill records if necessary */
        if (filepos > Fptr->filesize)
        {                    
          nloop = (long) ((filepos - (Fptr->filesize)) / IOBUFLEN); 
          for (jj = 0; jj < nloop && !(*status); jj++)
            ffwrite(Fptr, IOBUFLEN, zeros, status);

/*
ffseek(Fptr, filepos);
*/
          Fptr->filesize = filepos;   /* increment the file size */
        } 

        /* write the buffer itself */
        ffwrite(Fptr, IOBUFLEN, Fptr->iobuffer + (ibuff * IOBUFLEN), status);
        Fptr->dirty[ibuff] = FALSE;

        Fptr->filesize += IOBUFLEN;     /* increment the file size */
      } /* loop back if more buffers need to be written */

      Fptr->io_pos = Fptr->filesize;  /* currently positioned at EOF */
    }

    return(*status);       
}